

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

void ImageDither(Image *image,int rBpp,int gBpp,int bBpp,int aBpp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  Image image_00;
  int iVar5;
  Color *__ptr;
  void *pvVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined4 in_register_00000084;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  uchar uVar20;
  int iVar21;
  long lVar22;
  undefined4 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int local_7c;
  undefined4 in_stack_ffffffffffffff90;
  byte bVar26;
  byte bVar27;
  undefined8 in_stack_ffffffffffffffa0;
  
  if (((image->data == (void *)0x0) || (image->width == 0)) || (image->height == 0)) {
    return;
  }
  if (10 < image->format) {
    TraceLog(4,"IMAGE: Compressed data formats can not be dithered");
    return;
  }
  iVar5 = aBpp + bBpp;
  uVar11 = gBpp + rBpp + iVar5;
  if (0x10 < (int)uVar11) {
    TraceLog(4,"IMAGE: Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported",
             (ulong)uVar11);
    return;
  }
  uVar25._0_4_ = image->mipmaps;
  uVar25._4_4_ = image->format;
  uVar23 = (undefined4)((ulong)image->data >> 0x20);
  uVar24._0_4_ = image->width;
  uVar24._4_4_ = image->height;
  image_00.data._4_4_ = iVar5;
  image_00.data._0_4_ = in_stack_ffffffffffffff90;
  image_00.width = aBpp;
  image_00.height = in_register_00000084;
  image_00._16_8_ = in_stack_ffffffffffffffa0;
  __ptr = LoadImageColors(image_00);
  bVar26 = (byte)iVar5;
  free(image->data);
  if ((image->format != 4) && (image->format != 7)) {
    TraceLog(4,"IMAGE: Format is already 16bpp or lower, dithering could have no effect");
  }
  if (((bBpp == 5) && (rBpp == 5)) && ((gBpp == 6 && (aBpp == 0)))) {
    image->format = 3;
  }
  else if ((((bBpp == 5) && (rBpp == 5)) && (gBpp == 5)) && (aBpp == 1)) {
    image->format = 5;
  }
  else if (aBpp == 4 && (bBpp == 4 && (gBpp == 4 && rBpp == 4))) {
    image->format = 6;
  }
  else {
    image->format = 0;
    TraceLog(4,"IMAGE: Unsupported dithered OpenGL internal format: %ibpp (R%iG%iB%iA%i)",
             (ulong)uVar11,(ulong)(uint)rBpp,(ulong)(uint)gBpp,(ulong)(uint)bBpp,
             CONCAT44(uVar23,aBpp),uVar24,uVar25);
  }
  bVar27 = (byte)aBpp;
  iVar5 = image->height;
  pvVar6 = malloc((long)image->width * (long)iVar5 * 2);
  image->data = pvVar6;
  if (0 < (long)iVar5) {
    bVar7 = 8 - (char)rBpp;
    bVar8 = 8 - (char)gBpp;
    bVar9 = 8 - (char)bBpp;
    iVar5 = 0;
    local_7c = 1;
    do {
      iVar14 = image->width;
      if (0 < iVar14) {
        lVar17 = 0;
        do {
          lVar18 = iVar5 * iVar14 + lVar17;
          bVar1 = __ptr[lVar18].r >> (bVar7 & 0x1f);
          bVar2 = __ptr[lVar18].g >> (bVar8 & 0x1f);
          bVar3 = __ptr[lVar18].b >> (bVar9 & 0x1f);
          bVar4 = __ptr[lVar18].a >> (8 - bVar27 & 0x1f);
          iVar13 = (uint)__ptr[lVar18].r - ((uint)bVar1 << (bVar7 & 0x1f));
          iVar12 = (uint)__ptr[lVar18].g - ((uint)bVar2 << (bVar8 & 0x1f));
          iVar19 = (uint)__ptr[lVar18].b - ((uint)bVar3 << (bVar9 & 0x1f));
          __ptr[lVar18].r = bVar1;
          __ptr[lVar18].g = bVar2;
          __ptr[lVar18].b = bVar3;
          __ptr[lVar18].a = bVar4;
          iVar16 = (int)lVar17;
          if (iVar16 < iVar14 + -1) {
            iVar21 = (int)((float)iVar13 * 7.0 * 0.0625) + (uint)__ptr[lVar18 + 1].r;
            if (0xfe < iVar21) {
              iVar21 = 0xff;
            }
            __ptr[lVar18 + 1].r = (uchar)iVar21;
            iVar21 = (int)((float)iVar12 * 7.0 * 0.0625) + (uint)__ptr[lVar18 + 1].g;
            uVar20 = (uchar)iVar21;
            if (0xfe < iVar21) {
              uVar20 = 0xff;
            }
            __ptr[lVar18 + 1].g = uVar20;
            iVar21 = (int)((float)iVar19 * 7.0 * 0.0625) + (uint)__ptr[lVar18 + 1].b;
            uVar20 = (uchar)iVar21;
            if (0xfe < iVar21) {
              uVar20 = 0xff;
            }
            __ptr[lVar18 + 1].b = uVar20;
          }
          if ((iVar16 != 0) && (iVar5 < image->height + -1)) {
            lVar22 = (long)(local_7c * iVar14 + iVar16);
            iVar21 = (int)((float)iVar13 * 3.0 * 0.0625) + (uint)__ptr[lVar22 + -1].r;
            if (0xfe < iVar21) {
              iVar21 = 0xff;
            }
            __ptr[lVar22 + -1].r = (uchar)iVar21;
            iVar21 = (int)((float)iVar12 * 3.0 * 0.0625) + (uint)__ptr[lVar22 + -1].g;
            uVar20 = (uchar)iVar21;
            if (0xfe < iVar21) {
              uVar20 = 0xff;
            }
            __ptr[lVar22 + -1].g = uVar20;
            iVar21 = (int)((float)iVar19 * 3.0 * 0.0625) + (uint)__ptr[lVar22 + -1].b;
            uVar20 = (uchar)iVar21;
            if (0xfe < iVar21) {
              uVar20 = 0xff;
            }
            __ptr[lVar22 + -1].b = uVar20;
          }
          iVar21 = image->height + -1;
          if (iVar5 < iVar21) {
            iVar15 = local_7c * iVar14 + iVar16;
            iVar10 = (int)((float)iVar13 * 5.0 * 0.0625) + (uint)__ptr[iVar15].r;
            if (0xfe < iVar10) {
              iVar10 = 0xff;
            }
            __ptr[iVar15].r = (uchar)iVar10;
            iVar10 = (int)((float)iVar12 * 5.0 * 0.0625) + (uint)__ptr[iVar15].g;
            uVar20 = (uchar)iVar10;
            if (0xfe < iVar10) {
              uVar20 = 0xff;
            }
            __ptr[iVar15].g = uVar20;
            iVar10 = (int)((float)iVar19 * 5.0 * 0.0625) + (uint)__ptr[iVar15].b;
            uVar20 = (uchar)iVar10;
            if (0xfe < iVar10) {
              uVar20 = 0xff;
            }
            __ptr[iVar15].b = uVar20;
          }
          if (iVar16 < iVar14 + -1 && iVar5 < iVar21) {
            lVar22 = (long)(iVar14 * local_7c + iVar16);
            iVar14 = (int)((float)iVar13 * 0.0625) + (uint)__ptr[lVar22 + 1].r;
            uVar20 = (uchar)iVar14;
            if (0xfe < iVar14) {
              uVar20 = 0xff;
            }
            __ptr[lVar22 + 1].r = uVar20;
            iVar14 = (int)((float)iVar12 * 0.0625) + (uint)__ptr[lVar22 + 1].g;
            uVar20 = (uchar)iVar14;
            if (0xfe < iVar14) {
              uVar20 = 0xff;
            }
            __ptr[lVar22 + 1].g = uVar20;
            iVar14 = (int)((float)iVar19 * 0.0625) + (uint)__ptr[lVar22 + 1].b;
            uVar20 = (uchar)iVar14;
            if (0xfe < iVar14) {
              uVar20 = 0xff;
            }
            __ptr[lVar22 + 1].b = uVar20;
          }
          *(ushort *)((long)image->data + lVar18 * 2) =
               (ushort)bVar3 << (bVar27 & 0x1f) | (ushort)bVar4 |
               (ushort)bVar2 << (bVar26 & 0x1f) | (ushort)bVar1 << ((char)gBpp + bVar26 & 0x1f);
          iVar14 = image->width;
          lVar17 = lVar17 + 1;
        } while ((int)lVar17 < iVar14);
      }
      iVar5 = iVar5 + 1;
      local_7c = local_7c + 1;
    } while (iVar5 < image->height);
  }
  free(__ptr);
  return;
}

Assistant:

void ImageDither(Image *image, int rBpp, int gBpp, int bBpp, int aBpp)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Compressed data formats can not be dithered");
        return;
    }

    if ((rBpp + gBpp + bBpp + aBpp) > 16)
    {
        TRACELOG(LOG_WARNING, "IMAGE: Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported", (rBpp+gBpp+bBpp+aBpp));
    }
    else
    {
        Color *pixels = LoadImageColors(*image);

        RL_FREE(image->data);      // free old image data

        if ((image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8) && (image->format != PIXELFORMAT_UNCOMPRESSED_R8G8B8A8))
        {
            TRACELOG(LOG_WARNING, "IMAGE: Format is already 16bpp or lower, dithering could have no effect");
        }

        // Define new image format, check if desired bpp match internal known format
        if ((rBpp == 5) && (gBpp == 6) && (bBpp == 5) && (aBpp == 0)) image->format = PIXELFORMAT_UNCOMPRESSED_R5G6B5;
        else if ((rBpp == 5) && (gBpp == 5) && (bBpp == 5) && (aBpp == 1)) image->format = PIXELFORMAT_UNCOMPRESSED_R5G5B5A1;
        else if ((rBpp == 4) && (gBpp == 4) && (bBpp == 4) && (aBpp == 4)) image->format = PIXELFORMAT_UNCOMPRESSED_R4G4B4A4;
        else
        {
            image->format = 0;
            TRACELOG(LOG_WARNING, "IMAGE: Unsupported dithered OpenGL internal format: %ibpp (R%iG%iB%iA%i)", (rBpp+gBpp+bBpp+aBpp), rBpp, gBpp, bBpp, aBpp);
        }

        // NOTE: We will store the dithered data as unsigned short (16bpp)
        image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

        Color oldPixel = WHITE;
        Color newPixel = WHITE;

        int rError, gError, bError;
        unsigned short rPixel, gPixel, bPixel, aPixel;   // Used for 16bit pixel composition

        #define MIN(a,b) (((a)<(b))?(a):(b))

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                oldPixel = pixels[y*image->width + x];

                // NOTE: New pixel obtained by bits truncate, it would be better to round values (check ImageFormat())
                newPixel.r = oldPixel.r >> (8 - rBpp);     // R bits
                newPixel.g = oldPixel.g >> (8 - gBpp);     // G bits
                newPixel.b = oldPixel.b >> (8 - bBpp);     // B bits
                newPixel.a = oldPixel.a >> (8 - aBpp);     // A bits (not used on dithering)

                // NOTE: Error must be computed between new and old pixel but using same number of bits!
                // We want to know how much color precision we have lost...
                rError = (int)oldPixel.r - (int)(newPixel.r << (8 - rBpp));
                gError = (int)oldPixel.g - (int)(newPixel.g << (8 - gBpp));
                bError = (int)oldPixel.b - (int)(newPixel.b << (8 - bBpp));

                pixels[y*image->width + x] = newPixel;

                // NOTE: Some cases are out of the array and should be ignored
                if (x < (image->width - 1))
                {
                    pixels[y*image->width + x+1].r = MIN((int)pixels[y*image->width + x+1].r + (int)((float)rError*7.0f/16), 0xff);
                    pixels[y*image->width + x+1].g = MIN((int)pixels[y*image->width + x+1].g + (int)((float)gError*7.0f/16), 0xff);
                    pixels[y*image->width + x+1].b = MIN((int)pixels[y*image->width + x+1].b + (int)((float)bError*7.0f/16), 0xff);
                }

                if ((x > 0) && (y < (image->height - 1)))
                {
                    pixels[(y+1)*image->width + x-1].r = MIN((int)pixels[(y+1)*image->width + x-1].r + (int)((float)rError*3.0f/16), 0xff);
                    pixels[(y+1)*image->width + x-1].g = MIN((int)pixels[(y+1)*image->width + x-1].g + (int)((float)gError*3.0f/16), 0xff);
                    pixels[(y+1)*image->width + x-1].b = MIN((int)pixels[(y+1)*image->width + x-1].b + (int)((float)bError*3.0f/16), 0xff);
                }

                if (y < (image->height - 1))
                {
                    pixels[(y+1)*image->width + x].r = MIN((int)pixels[(y+1)*image->width + x].r + (int)((float)rError*5.0f/16), 0xff);
                    pixels[(y+1)*image->width + x].g = MIN((int)pixels[(y+1)*image->width + x].g + (int)((float)gError*5.0f/16), 0xff);
                    pixels[(y+1)*image->width + x].b = MIN((int)pixels[(y+1)*image->width + x].b + (int)((float)bError*5.0f/16), 0xff);
                }

                if ((x < (image->width - 1)) && (y < (image->height - 1)))
                {
                    pixels[(y+1)*image->width + x+1].r = MIN((int)pixels[(y+1)*image->width + x+1].r + (int)((float)rError*1.0f/16), 0xff);
                    pixels[(y+1)*image->width + x+1].g = MIN((int)pixels[(y+1)*image->width + x+1].g + (int)((float)gError*1.0f/16), 0xff);
                    pixels[(y+1)*image->width + x+1].b = MIN((int)pixels[(y+1)*image->width + x+1].b + (int)((float)bError*1.0f/16), 0xff);
                }

                rPixel = (unsigned short)newPixel.r;
                gPixel = (unsigned short)newPixel.g;
                bPixel = (unsigned short)newPixel.b;
                aPixel = (unsigned short)newPixel.a;

                ((unsigned short *)image->data)[y*image->width + x] = (rPixel << (gBpp + bBpp + aBpp)) | (gPixel << (bBpp + aBpp)) | (bPixel << aBpp) | aPixel;
            }
        }

        UnloadImageColors(pixels);
    }
}